

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall inja::Parser::parse_into(Parser *this,Template *tmpl,path *path)

{
  Kind KVar1;
  BlockNode *pBVar2;
  bool bVar3;
  Token *this_00;
  string_view input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  path *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  Token *local_48;
  shared_ptr<inja::ExpressionListNode> expression_list_node;
  
  input._M_str = (tmpl->content)._M_dataplus._M_p;
  input._M_len = (tmpl->content)._M_string_length;
  local_90 = path;
  Lexer::start(&this->lexer,input);
  this->current_block = &tmpl->root;
  local_48 = &this->tok;
  this_00 = local_48;
LAB_00147f67:
  get_next_token(this);
  KVar1 = (this->tok).kind;
  switch(KVar1) {
  case Text:
    pBVar2 = this->current_block;
    local_88._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)(this->tok).text._M_len;
    ::std::make_shared<inja::TextNode,long,unsigned_long>
              ((long *)&local_b0,(unsigned_long *)&local_88);
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::TextNode>>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&pBVar2->nodes,(shared_ptr<inja::TextNode> *)&local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    this_00 = local_48;
    goto LAB_00147f67;
  case ExpressionOpen:
    get_next_token(this);
    local_b0._M_dataplus._M_p = (this->tok).text._M_str + -(long)(tmpl->content)._M_dataplus._M_p;
    ::std::make_shared<inja::ExpressionListNode,long>((long *)&expression_list_node);
    ::std::vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>::
    emplace_back<std::shared_ptr<inja::ExpressionListNode>&>
              ((vector<std::shared_ptr<inja::AstNode>,std::allocator<std::shared_ptr<inja::AstNode>>>
                *)&this->current_block->nodes,&expression_list_node);
    this->current_expression_list =
         expression_list_node.
         super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = parse_expression(this,tmpl,ExpressionClose);
    if (!bVar3) {
      Token::describe_abi_cxx11_(&local_68,this_00);
      ::std::operator+(&local_88,"expected expression close, got \'",&local_68);
      ::std::operator+(&local_b0,&local_88,"\'");
      throw_parser_error(this,&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_68);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expression_list_node.
                super___shared_ptr<inja::ExpressionListNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    goto LAB_00147f67;
  case ExpressionClose:
  case LineStatementClose:
  case StatementClose:
    goto switchD_00147f8a_caseD_2;
  case LineStatementOpen:
    get_next_token(this);
    bVar3 = parse_statement(this,tmpl,LineStatementClose,local_90);
    if (!bVar3) {
      Token::describe_abi_cxx11_(&local_68,this_00);
      ::std::operator+(&local_88,"expected statement, got \'",&local_68);
      ::std::operator+(&local_b0,&local_88,"\'");
      throw_parser_error(this,&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_68);
    }
    if ((this_00->kind != LineStatementClose) && (this_00->kind != Eof)) {
      Token::describe_abi_cxx11_(&local_68,this_00);
      ::std::operator+(&local_88,"expected line statement close, got \'",&local_68);
      ::std::operator+(&local_b0,&local_88,"\'");
      throw_parser_error(this,&local_b0);
      break;
    }
    goto LAB_00147f67;
  case StatementOpen:
    get_next_token(this);
    bVar3 = parse_statement(this,tmpl,StatementClose,local_90);
    if (!bVar3) {
      Token::describe_abi_cxx11_(&local_68,this_00);
      ::std::operator+(&local_88,"expected statement, got \'",&local_68);
      ::std::operator+(&local_b0,&local_88,"\'");
      throw_parser_error(this,&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_68);
    }
    if (this_00->kind == StatementClose) goto LAB_00147f67;
    Token::describe_abi_cxx11_(&local_68,this_00);
    ::std::operator+(&local_88,"expected statement close, got \'",&local_68);
    ::std::operator+(&local_b0,&local_88,"\'");
    throw_parser_error(this,&local_b0);
    break;
  case CommentOpen:
    goto switchD_00147f8a_caseD_7;
  default:
    if (KVar1 == Eof) {
      if ((this->if_statement_stack).c.
          super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (this->if_statement_stack).c.
          super__Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"unmatched if",(allocator<char> *)&local_88);
        throw_parser_error(this,&local_b0);
        ::std::__cxx11::string::~string((string *)&local_b0);
      }
      if ((this->for_statement_stack).c.
          super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (this->for_statement_stack).c.
          super__Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"unmatched for",(allocator<char> *)&local_88);
        throw_parser_error(this,&local_b0);
        ::std::__cxx11::string::~string((string *)&local_b0);
      }
      this->current_block = (BlockNode *)0x0;
      return;
    }
switchD_00147f8a_caseD_2:
    Token::describe_abi_cxx11_(&local_68,this_00);
    ::std::operator+(&local_88,"unexpected token \'",&local_68);
    ::std::operator+(&local_b0,&local_88,"\'");
    throw_parser_error(this,&local_b0);
  }
  goto LAB_001482ca;
switchD_00147f8a_caseD_7:
  get_next_token(this);
  if ((this->tok).kind == CommentClose) goto LAB_00147f67;
  Token::describe_abi_cxx11_(&local_68,this_00);
  ::std::operator+(&local_88,"expected comment close, got \'",&local_68);
  ::std::operator+(&local_b0,&local_88,"\'");
  throw_parser_error(this,&local_b0);
LAB_001482ca:
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::__cxx11::string::~string((string *)&local_68);
  goto LAB_00147f67;
}

Assistant:

void parse_into(Template& tmpl, const std::filesystem::path& path) {
    lexer.start(tmpl.content);
    current_block = &tmpl.root;

    for (;;) {
      get_next_token();
      switch (tok.kind) {
      case Token::Kind::Eof: {
        if (!if_statement_stack.empty()) {
          throw_parser_error("unmatched if");
        }
        if (!for_statement_stack.empty()) {
          throw_parser_error("unmatched for");
        }
      }
        current_block = nullptr;
        return;
      case Token::Kind::Text: {
        current_block->nodes.emplace_back(std::make_shared<TextNode>(tok.text.data() - tmpl.content.c_str(), tok.text.size()));
      } break;
      case Token::Kind::StatementOpen: {
        get_next_token();
        if (!parse_statement(tmpl, Token::Kind::StatementClose, path)) {
          throw_parser_error("expected statement, got '" + tok.describe() + "'");
        }
        if (tok.kind != Token::Kind::StatementClose) {
          throw_parser_error("expected statement close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::LineStatementOpen: {
        get_next_token();
        if (!parse_statement(tmpl, Token::Kind::LineStatementClose, path)) {
          throw_parser_error("expected statement, got '" + tok.describe() + "'");
        }
        if (tok.kind != Token::Kind::LineStatementClose && tok.kind != Token::Kind::Eof) {
          throw_parser_error("expected line statement close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::ExpressionOpen: {
        get_next_token();

        auto expression_list_node = std::make_shared<ExpressionListNode>(tok.text.data() - tmpl.content.c_str());
        current_block->nodes.emplace_back(expression_list_node);
        current_expression_list = expression_list_node.get();

        if (!parse_expression(tmpl, Token::Kind::ExpressionClose)) {
          throw_parser_error("expected expression close, got '" + tok.describe() + "'");
        }
      } break;
      case Token::Kind::CommentOpen: {
        get_next_token();
        if (tok.kind != Token::Kind::CommentClose) {
          throw_parser_error("expected comment close, got '" + tok.describe() + "'");
        }
      } break;
      default: {
        throw_parser_error("unexpected token '" + tok.describe() + "'");
      } break;
      }
    }
    current_block = nullptr;
  }